

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O1

Vector<Fad<double>_> * __thiscall
Vector<Fad<double>_>::operator=(Vector<Fad<double>_> *this,Vector<Fad<double>_> *a)

{
  int iVar1;
  double dVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  Fad<double> *pFVar6;
  long lVar7;
  
  if (this != a) {
    if (this->num_elts == 0) {
      iVar1 = a->num_elts;
      lVar7 = (long)iVar1;
      if (lVar7 == 0) {
        return this;
      }
      this->num_elts = iVar1;
      uVar5 = 0xffffffffffffffff;
      if (-1 < iVar1) {
        uVar5 = lVar7 * 0x20 + 8;
      }
      plVar3 = (long *)operator_new__(uVar5);
      *plVar3 = lVar7;
      lVar4 = 0;
      pFVar6 = (Fad<double> *)(plVar3 + 1);
      do {
        Fad<double>::Fad(pFVar6);
        lVar4 = lVar4 + -0x20;
        pFVar6 = pFVar6 + 1;
      } while (-lVar4 != lVar7 * 0x20);
      this->ptr_to_data = (Fad<double> *)(plVar3 + 1);
    }
    if (this->num_elts != a->num_elts) {
      pFVar6 = this->ptr_to_data;
      if (pFVar6 != (Fad<double> *)0x0) {
        dVar2 = pFVar6[-1].defaultVal;
        if (dVar2 != 0.0) {
          lVar7 = (long)dVar2 << 5;
          do {
            Fad<double>::~Fad((Fad<double> *)((long)&pFVar6[-1].val_ + lVar7));
            lVar7 = lVar7 + -0x20;
          } while (lVar7 != 0);
        }
        operator_delete__(&pFVar6[-1].defaultVal,(long)dVar2 << 5 | 8);
      }
      this->num_elts = 0;
      this->ptr_to_data = (Fad<double> *)0x0;
      iVar1 = a->num_elts;
      lVar7 = (long)iVar1;
      if (lVar7 != 0) {
        this->num_elts = iVar1;
        uVar5 = 0xffffffffffffffff;
        if (-1 < iVar1) {
          uVar5 = lVar7 * 0x20 + 8;
        }
        plVar3 = (long *)operator_new__(uVar5);
        *plVar3 = lVar7;
        lVar4 = 0;
        pFVar6 = (Fad<double> *)(plVar3 + 1);
        do {
          Fad<double>::Fad(pFVar6);
          lVar4 = lVar4 + -0x20;
          pFVar6 = pFVar6 + 1;
        } while (-lVar4 != lVar7 * 0x20);
        this->ptr_to_data = (Fad<double> *)(plVar3 + 1);
      }
    }
    MEM_CPY<Fad<double>_>::copy
              ((MEM_CPY<Fad<double>_> *)this->ptr_to_data,(EVP_PKEY_CTX *)a->ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)(uint)this->num_elts);
  }
  return this;
}

Assistant:

Vector< T >& Vector< T >::operator = (const Vector< T >& a)
{
  if ( this != &a) {
    // Cas ou le pointeur est non alloue
    if ( num_elts == 0 ) {
      if ( a.num_elts == 0 ) return (*this);
      else reserve(a.num_elts);
    }
    // Cas ou le pointeur est deja alloue
    if ( num_elts != a.num_elts ) {
      //cerr << "size = " << num_elts << ", a.size = " << a.num_elts << endl;
      //cerr << "ptr_to_data = " << (void*)ptr_to_data << ", a.ptr_to_data = " << (void*)a.ptr_to_data << endl;
      //error("Vector::operator=, tailles incompatibles");
      destroy();//on desalloue
      reserve(a.num_elts);
    }
    
    copy(a);
  }

  return *this;
}